

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedShaderImpl.cpp
# Opt level: O1

void __thiscall Diligent::SerializedShaderImpl::~SerializedShaderImpl(SerializedShaderImpl *this)

{
  long *plVar1;
  void *ptr;
  IShaderSourceInputStreamFactory *pIVar2;
  long lVar3;
  
  GetStatus(this,true);
  lVar3 = 0;
  do {
    plVar1 = *(long **)((long)&(this->m_Shaders)._M_elems[6]._M_t.
                               super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
                               .
                               super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>
                               ._M_head_impl + lVar3);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    *(undefined8 *)
     ((long)&(this->m_Shaders)._M_elems[6]._M_t.
             super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
             ._M_t.
             super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
             .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>.
             _M_head_impl + lVar3) = 0;
    lVar3 = lVar3 + -8;
  } while (lVar3 != -0x38);
  ptr = (this->m_CreateInfo).m_pRawMemory._M_t.
        super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
        super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
        super__Head_base<0UL,_void_*,_false>._M_head_impl;
  if (ptr != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&(this->m_CreateInfo).m_pRawMemory,
               ptr);
  }
  (this->m_CreateInfo).m_pRawMemory._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  pIVar2 = (this->m_CreateInfo).m_SourceFactory.m_pObject;
  if (pIVar2 != (IShaderSourceInputStreamFactory *)0x0) {
    (*(pIVar2->super_IObject)._vptr_IObject[2])();
    (this->m_CreateInfo).m_SourceFactory.m_pObject = (IShaderSourceInputStreamFactory *)0x0;
  }
  return;
}

Assistant:

SerializedShaderImpl::~SerializedShaderImpl()
{
    // Make sure that all asynchrous tasks are complete.
    GetStatus(/*WaitForCompletion = */ true);
}